

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigFeed.c
# Opt level: O0

void Fraig_FeedBackCheckTable(Fraig_Man_t *p)

{
  Fraig_HashTable_t *pFVar1;
  int iVar2;
  int local_34;
  int nPairs;
  int m;
  int k;
  int i;
  Fraig_Node_t *pEntD;
  Fraig_Node_t *pEntF;
  Fraig_HashTable_t *pT;
  Fraig_Man_t *p_local;
  
  pFVar1 = p->pTableF;
  for (m = 0; m < pFVar1->nBins; m = m + 1) {
    for (pEntD = pFVar1->pBins[m]; pEntD != (Fraig_Node_t *)0x0; pEntD = pEntD->pNextF) {
      p->vCones->nSize = 0;
      for (_k = pEntD; _k != (Fraig_Node_t *)0x0; _k = _k->pNextD) {
        Fraig_NodeVecPush(p->vCones,_k);
      }
      if (p->vCones->nSize != 1) {
        for (nPairs = 0; local_34 = nPairs, nPairs < p->vCones->nSize; nPairs = nPairs + 1) {
          while (local_34 = local_34 + 1, local_34 < p->vCones->nSize) {
            iVar2 = Fraig_CompareSimInfo
                              (p->vCones->pArray[nPairs],p->vCones->pArray[local_34],p->iWordStart,0
                              );
            if (iVar2 != 0) {
              printf("Nodes %d and %d have the same D simulation info.\n",
                     (ulong)(uint)p->vCones->pArray[nPairs]->Num,
                     (ulong)(uint)p->vCones->pArray[local_34]->Num);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Fraig_FeedBackCheckTable( Fraig_Man_t * p )
{
    Fraig_HashTable_t * pT = p->pTableF;
    Fraig_Node_t * pEntF, * pEntD;
    int i, k, m, nPairs;

    nPairs = 0;
    for ( i = 0; i < pT->nBins; i++ )
    Fraig_TableBinForEachEntryF( pT->pBins[i], pEntF )
    {
        p->vCones->nSize = 0;
        Fraig_TableBinForEachEntryD( pEntF, pEntD )
            Fraig_NodeVecPush( p->vCones, pEntD );
        if ( p->vCones->nSize == 1 )
            continue;
        for ( k = 0; k < p->vCones->nSize; k++ )
            for ( m = k+1; m < p->vCones->nSize; m++ )
            {
                if ( Fraig_CompareSimInfo( p->vCones->pArray[k], p->vCones->pArray[m], p->iWordStart, 0 ) )
                    printf( "Nodes %d and %d have the same D simulation info.\n", 
                        p->vCones->pArray[k]->Num, p->vCones->pArray[m]->Num );
                nPairs++;
            }   
    }
//    printf( "\nThe total of %d node pairs have been verified.\n", nPairs );
}